

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_pow.c
# Opt level: O0

word zzPowerModW(word a,word b,word mod,void *stack)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  long lVar14;
  ulong uVar15;
  size_t sVar16;
  ulong *in_RCX;
  undefined8 in_RDX;
  ulong in_RSI;
  ulong in_RDI;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  word *powers;
  size_t slide_size;
  size_t pos;
  word slide;
  dword prod;
  long local_70;
  long local_68;
  long local_50;
  long local_48;
  ulong local_40;
  long local_30;
  ulong local_10;
  word local_8;
  
  if (in_RSI == 0) {
    local_8 = 1;
  }
  else {
    auVar17._8_8_ = 0;
    auVar17._0_8_ = in_RDI;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = in_RDI;
    auVar17 = __umodti3(SUB168(auVar17 * auVar7,0),SUB168(auVar17 * auVar7,8),in_RDX);
    *in_RCX = auVar17._0_8_;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = auVar17._0_8_;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = in_RDI;
    auVar17 = __umodti3(SUB168(auVar1 * auVar8,0),SUB168(auVar1 * auVar8,8) + auVar17._8_8_ * in_RDI
                        ,in_RDX,0);
    in_RCX[1] = auVar17._0_8_;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = auVar17._0_8_;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = *in_RCX;
    auVar17 = __umodti3(SUB168(auVar2 * auVar9,0),
                        SUB168(auVar2 * auVar9,8) + auVar17._8_8_ * *in_RCX,in_RDX,0);
    in_RCX[2] = auVar17._0_8_;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = auVar17._0_8_;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = *in_RCX;
    uVar15 = __umodti3(SUB168(auVar3 * auVar10,0),
                       SUB168(auVar3 * auVar10,8) + auVar17._8_8_ * *in_RCX,in_RDX,0);
    in_RCX[3] = uVar15;
    *in_RCX = in_RDI;
    sVar16 = u64CLZ(0x170e7b);
    lVar14 = -sVar16;
    if (lVar14 + 0x40U < 3) {
      local_68 = lVar14 + 0x40;
    }
    else {
      local_68 = 3;
    }
    local_50 = local_68;
    for (local_40 = (1L << ((byte)local_68 & 0x3f)) - 1U &
                    in_RSI >> (((char)(lVar14 + 0x3f) + '\x01') - (byte)local_68 & 0x3f);
        (local_40 & 1) == 0; local_40 = local_40 >> 1) {
      local_50 = local_50 + -1;
    }
    local_10 = in_RCX[local_40 >> 1];
    local_48 = (lVar14 + 0x3f) - local_50;
    while (local_48 != -1) {
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_10;
      if ((in_RSI & 1L << ((byte)local_48 & 0x3f)) == 0) {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_10;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = local_10;
        local_10 = __umodti3(SUB168(auVar4 * auVar11,0),SUB168(auVar4 * auVar11,8),in_RDX,0);
        local_48 = local_48 + -1;
      }
      else {
        if (local_48 + 1U < 3) {
          local_70 = local_48 + 1;
        }
        else {
          local_70 = 3;
        }
        local_50 = local_70;
        for (local_40 = (1L << ((byte)local_70 & 0x3f)) - 1U &
                        in_RSI >> (((byte)local_48 + 1) - (byte)local_70 & 0x3f);
            (local_40 & 1) == 0; local_40 = local_40 >> 1) {
          local_50 = local_50 + -1;
        }
        local_48 = local_48 - local_50;
        while( true ) {
          local_30 = auVar18._8_8_;
          local_10 = auVar18._0_8_;
          if (local_50 == 0) break;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = local_10;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = local_10;
          auVar18 = __umodti3(SUB168(auVar5 * auVar12,0),
                              SUB168(auVar5 * auVar12,8) + local_30 * local_10,in_RDX,0);
          local_50 = local_50 + -1;
        }
        uVar15 = *(ulong *)((long)in_RCX + (local_40 & 0xfffffffffffffffe) * 4);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = local_10;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = uVar15;
        local_10 = __umodti3(SUB168(auVar6 * auVar13,0),
                             SUB168(auVar6 * auVar13,8) + local_30 * uVar15,in_RDX,0);
      }
    }
    local_8 = local_10;
  }
  return local_8;
}

Assistant:

word zzPowerModW(register word a, register word b, register word mod, 
	void* stack)
{
	register dword prod;
	register word slide;
	register size_t pos;
	register size_t slide_size;
	// переменные в stack
	word* powers;	/* [4]powers */
	// pre
	ASSERT(mod != 0);
	// b == 0?
	if (b == 0)
		return 1;
	// раскладка stack
	powers = (word*)stack;
	// powers <- малые нечетные степени a
	prod = a;
	prod *= a, prod %= mod, powers[0] = (word)prod;
	prod *= a, prod %= mod, powers[1] = (word)prod;
	prod *= powers[0], prod %= mod, powers[2] = (word)prod;
	prod *= powers[0], prod %= mod, powers[3] = (word)prod;
	powers[0] = a;
	// pos <- номер старшего единичного бита b
	pos = B_PER_W - 1 - wordCLZ(b);
	// slide <- старший слайд b
	slide_size = MIN2(pos + 1, 3);
	slide = b >> (pos + 1 - slide_size);
	slide &= WORD_BIT_POS(slide_size) - 1;
	for (; slide % 2 == 0; slide >>= 1, slide_size--);
	// a <- powers[slide / 2]
	a = powers[slide / 2];
	pos -= slide_size;
	// пробегаем биты b
	while (pos != SIZE_MAX)
	{
		prod = a;
		if ((b & WORD_BIT_POS(pos)) == 0)
		{
			// a <- a^2 \mod mod
			prod *= a, a = prod % mod;
			--pos;
		}
		else
		{
			// slide <- очередной слайд b
			slide_size = MIN2(pos + 1, 3);
			slide = b >> (pos + 1 - slide_size);
			slide &= WORD_BIT_POS(slide_size) - 1;
			for (; slide % 2 == 0; slide >>= 1, slide_size--);
			pos -= slide_size;
			// a <- a^2 \mod mod
			while (slide_size--)
				prod *= a, prod %= mod, a = (word)prod;
			// a <- a * powers[slide / 2] \mod mod
			prod *= powers[slide / 2];
			prod %= mod;
			a = (word)prod;
		}
	}
	// выход
	prod = 0, slide = b = mod = 0, pos = slide_size = 0;
	return a;
}